

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_data_collection_segment.cpp
# Opt level: O2

idx_t __thiscall
duckdb::ColumnDataCollectionSegment::ReadVector
          (ColumnDataCollectionSegment *this,ChunkManagementState *state,
          VectorDataIndex vector_index,Vector *result)

{
  vector<duckdb::VectorMetaData,_true> *this_00;
  PhysicalType PVar1;
  pointer pSVar2;
  ColumnDataCollectionSegment *this_01;
  idx_t iVar3;
  reference pvVar4;
  ColumnDataAllocator *pCVar5;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
  *this_02;
  VectorDataIndex vector_index_00;
  reference this_03;
  type result_00;
  idx_t iVar6;
  InternalException *this_04;
  Vector *result_01;
  reference pvVar7;
  ulong child_entry;
  idx_t offset;
  ulong uVar8;
  long lVar9;
  SwizzleMetaData *swizzle_segment;
  pointer pSVar10;
  idx_t local_90;
  allocator local_81;
  idx_t local_80;
  ColumnDataCollectionSegment *local_78;
  ChunkManagementState *local_70;
  reference local_68;
  reference local_60;
  ulong local_58;
  string local_50;
  
  this_00 = &this->vector_data;
  local_68 = (reference)&this->child_indices;
  uVar8 = 0;
  local_78 = this;
  local_70 = state;
  do {
    PVar1 = (result->type).physical_type_;
    local_60 = vector<duckdb::VectorMetaData,_true>::get<true>(this_00,vector_index.index);
    if (local_60->count == 0) {
      iVar3 = 0;
LAB_00274a7d:
      if ((uVar8 & 1) != 0) {
        iVar3 = local_90;
      }
      return iVar3;
    }
    iVar3 = ReadVectorInternal(local_78,local_70,vector_index,result);
    if (PVar1 != ARRAY) {
      local_80 = iVar3;
      if (PVar1 == LIST) {
        result_01 = ListVector::GetEntry(result);
        pvVar4 = vector<duckdb::VectorDataIndex,_true>::get<true>
                           ((vector<duckdb::VectorDataIndex,_true> *)local_68,
                            (local_60->child_index).index);
        iVar3 = ReadVector(local_78,local_70,(VectorDataIndex)pvVar4->index,result_01);
        ListVector::SetListSize(result,iVar3);
        iVar3 = local_80;
      }
      else if (PVar1 == STRUCT) {
        this_02 = StructVector::GetEntries(result);
        this_01 = local_78;
        iVar3 = local_80;
        child_entry = 0;
        while (child_entry <
               (ulong)((long)(this_02->
                             super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                             ).
                             super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this_02->
                             super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                             ).
                             super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 3)) {
          vector_index_00 = GetChildIndex(this_01,(local_60->child_index).index,child_entry);
          this_03 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                    ::get<true>(this_02,child_entry);
          result_00 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::
                      operator*(this_03);
          iVar6 = ReadVector(this_01,local_70,vector_index_00,result_00);
          child_entry = child_entry + 1;
          if (iVar6 != iVar3) {
            this_04 = (InternalException *)__cxa_allocate_exception(0x10);
            ::std::__cxx11::string::string
                      ((string *)&local_50,"Column Data Collection: mismatch in struct child sizes",
                       &local_81);
            InternalException::InternalException(this_04,&local_50);
            __cxa_throw(this_04,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
          }
        }
      }
      else if (PVar1 == VARCHAR) {
        local_58 = uVar8;
        pCVar5 = shared_ptr<duckdb::ColumnDataAllocator,_true>::operator->(&local_78->allocator);
        if (pCVar5->type == BUFFER_MANAGER_ALLOCATOR) {
          lVar9 = 0;
          while (vector_index.index != 0xffffffffffffffff) {
            local_68 = vector<duckdb::VectorMetaData,_true>::get<true>(this_00,vector_index.index);
            pSVar2 = (local_68->swizzle_data).
                     super_vector<duckdb::SwizzleMetaData,_std::allocator<duckdb::SwizzleMetaData>_>
                     .
                     super__Vector_base<duckdb::SwizzleMetaData,_std::allocator<duckdb::SwizzleMetaData>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            for (pSVar10 = (local_68->swizzle_data).
                           super_vector<duckdb::SwizzleMetaData,_std::allocator<duckdb::SwizzleMetaData>_>
                           .
                           super__Vector_base<duckdb::SwizzleMetaData,_std::allocator<duckdb::SwizzleMetaData>_>
                           ._M_impl.super__Vector_impl_data._M_start; pSVar10 != pSVar2;
                pSVar10 = pSVar10 + 1) {
              pvVar7 = vector<duckdb::VectorMetaData,_true>::get<true>
                                 (this_00,(pSVar10->child_index).index);
              pCVar5 = shared_ptr<duckdb::ColumnDataAllocator,_true>::operator->
                                 (&local_78->allocator);
              ColumnDataAllocator::UnswizzlePointers
                        (pCVar5,local_70,result,(ulong)pSVar10->offset + lVar9,pSVar10->count,
                         pvVar7->block_id,pvVar7->offset);
            }
            lVar9 = lVar9 + (ulong)local_68->count;
            vector_index.index = (local_68->next_data).index;
          }
        }
        iVar3 = local_80;
        uVar8 = local_58;
        if (local_70->properties == DISALLOW_ZERO_COPY) {
          VectorOperations::Copy(result,result,(ulong)local_60->count,0,0);
          uVar8 = local_58;
        }
      }
      goto LAB_00274a7d;
    }
    result = ArrayVector::GetEntry(result);
    pvVar4 = vector<duckdb::VectorDataIndex,_true>::get<true>
                       ((vector<duckdb::VectorDataIndex,_true> *)local_68,
                        (local_60->child_index).index);
    vector_index.index = pvVar4->index;
    if (uVar8 == 0) {
      local_90 = iVar3;
    }
    uVar8 = 1;
  } while( true );
}

Assistant:

idx_t ColumnDataCollectionSegment::ReadVector(ChunkManagementState &state, VectorDataIndex vector_index,
                                              Vector &result) {
	auto &vector_type = result.GetType();
	auto internal_type = vector_type.InternalType();
	auto &vdata = GetVectorData(vector_index);
	if (vdata.count == 0) {
		return 0;
	}
	auto vcount = ReadVectorInternal(state, vector_index, result);
	if (internal_type == PhysicalType::LIST) {
		// list: copy child
		auto &child_vector = ListVector::GetEntry(result);
		auto child_count = ReadVector(state, GetChildIndex(vdata.child_index), child_vector);
		ListVector::SetListSize(result, child_count);
	} else if (internal_type == PhysicalType::ARRAY) {
		auto &child_vector = ArrayVector::GetEntry(result);
		auto child_count = ReadVector(state, GetChildIndex(vdata.child_index), child_vector);
		(void)child_count;
	} else if (internal_type == PhysicalType::STRUCT) {
		auto &child_vectors = StructVector::GetEntries(result);
		for (idx_t child_idx = 0; child_idx < child_vectors.size(); child_idx++) {
			auto child_count =
			    ReadVector(state, GetChildIndex(vdata.child_index, child_idx), *child_vectors[child_idx]);
			if (child_count != vcount) {
				throw InternalException("Column Data Collection: mismatch in struct child sizes");
			}
		}
	} else if (internal_type == PhysicalType::VARCHAR) {
		if (allocator->GetType() == ColumnDataAllocatorType::BUFFER_MANAGER_ALLOCATOR) {
			auto next_index = vector_index;
			idx_t offset = 0;
			while (next_index.IsValid()) {
				auto &current_vdata = GetVectorData(next_index);
				for (auto &swizzle_segment : current_vdata.swizzle_data) {
					auto &string_heap_segment = GetVectorData(swizzle_segment.child_index);
					allocator->UnswizzlePointers(state, result, offset + swizzle_segment.offset, swizzle_segment.count,
					                             string_heap_segment.block_id, string_heap_segment.offset);
				}
				offset += current_vdata.count;
				next_index = current_vdata.next_data;
			}
		}
		if (state.properties == ColumnDataScanProperties::DISALLOW_ZERO_COPY) {
			VectorOperations::Copy(result, result, vdata.count, 0, 0);
		}
	}
	return vcount;
}